

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O2

XIO_HANDLE
xio_create(IO_INTERFACE_DESCRIPTION *io_interface_description,void *xio_create_parameters)

{
  IO_CREATE p_Var1;
  XIO_HANDLE __ptr;
  CONCRETE_IO_HANDLE pvVar2;
  
  if ((((((io_interface_description != (IO_INTERFACE_DESCRIPTION *)0x0) &&
         (io_interface_description->concrete_io_retrieveoptions != (IO_RETRIEVEOPTIONS)0x0)) &&
        (p_Var1 = io_interface_description->concrete_io_create, p_Var1 != (IO_CREATE)0x0)) &&
       ((io_interface_description->concrete_io_destroy != (IO_DESTROY)0x0 &&
        (io_interface_description->concrete_io_open != (IO_OPEN)0x0)))) &&
      ((io_interface_description->concrete_io_close != (IO_CLOSE)0x0 &&
       ((io_interface_description->concrete_io_send != (IO_SEND)0x0 &&
        (io_interface_description->concrete_io_dowork != (IO_DOWORK)0x0)))))) &&
     ((io_interface_description->concrete_io_setoption != (IO_SETOPTION)0x0 &&
      (__ptr = (XIO_HANDLE)malloc(0x10), __ptr != (XIO_HANDLE)0x0)))) {
    __ptr->io_interface_description = io_interface_description;
    pvVar2 = (*p_Var1)(xio_create_parameters);
    __ptr->concrete_xio_handle = pvVar2;
    if (pvVar2 != (CONCRETE_IO_HANDLE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (XIO_HANDLE)0x0;
}

Assistant:

XIO_HANDLE xio_create(const IO_INTERFACE_DESCRIPTION* io_interface_description, const void* xio_create_parameters)
{
    XIO_INSTANCE* xio_instance;
    /* Codes_SRS_XIO_01_003: [If the argument io_interface_description is NULL, xio_create shall return NULL.] */
    if ((io_interface_description == NULL) ||
        /* Codes_SRS_XIO_01_004: [If any io_interface_description member is NULL, xio_create shall return NULL.] */
        (io_interface_description->concrete_io_retrieveoptions == NULL) ||
        (io_interface_description->concrete_io_create == NULL) ||
        (io_interface_description->concrete_io_destroy == NULL) ||
        (io_interface_description->concrete_io_open == NULL) ||
        (io_interface_description->concrete_io_close == NULL) ||
        (io_interface_description->concrete_io_send == NULL) ||
        (io_interface_description->concrete_io_dowork == NULL) ||
        (io_interface_description->concrete_io_setoption == NULL))
    {
        xio_instance = NULL;
    }
    else
    {
        xio_instance = (XIO_INSTANCE*)malloc(sizeof(XIO_INSTANCE));

        /* Codes_SRS_XIO_01_017: [If allocating the memory needed for the IO interface fails then xio_create shall return NULL.] */
        if (xio_instance != NULL)
        {
            /* Codes_SRS_XIO_01_001: [xio_create shall return on success a non-NULL handle to a new IO interface.] */
            xio_instance->io_interface_description = io_interface_description;

            /* Codes_SRS_XIO_01_002: [In order to instantiate the concrete IO implementation the function concrete_io_create from the io_interface_description shall be called, passing the xio_create_parameters argument.] */
            xio_instance->concrete_xio_handle = xio_instance->io_interface_description->concrete_io_create((void*)xio_create_parameters);

            /* Codes_SRS_XIO_01_016: [If the underlying concrete_io_create call fails, xio_create shall return NULL.] */
            if (xio_instance->concrete_xio_handle == NULL)
            {
                free(xio_instance);
                xio_instance = NULL;
            }
        }
    }
    return (XIO_HANDLE)xio_instance;
}